

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

void Pdr_QueueStop(Pdr_Man_t *p)

{
  Pdr_Obl_t *pRes;
  Pdr_Obl_t *p_00;
  
  p_00 = p->pQueue;
  while (p_00 != (Pdr_Obl_t *)0x0) {
    p->pQueue = p_00->pLink;
    Pdr_OblDeref(p_00);
    p->nQueCur = p->nQueCur + -1;
    Pdr_OblDeref(p_00);
    p_00 = p->pQueue;
  }
  p->pQueue = (Pdr_Obl_t *)0x0;
  p->nQueCur = 0;
  return;
}

Assistant:

void Pdr_QueueStop( Pdr_Man_t * p )
{
    Pdr_Obl_t * pObl;
    while ( !Pdr_QueueIsEmpty(p) )
    {
        pObl = Pdr_QueuePop(p);
        Pdr_OblDeref( pObl );
    }
    p->pQueue = NULL;
    p->nQueCur = 0;
}